

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_delimited.pb.cc
# Opt level: O2

void editions_unittest::TestDelimited::SharedDtor(MessageLite *self)

{
  TestDelimited_LengthPrefixed *this;
  TestDelimited *this_00;
  TestDelimited_GroupLike *pTVar1;
  NotGroupLikeScope *this_01;
  MessageImport *this_02;
  ulong uVar2;
  LogMessageFatal local_20;
  
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  uVar2 = (self->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 == 0) {
    this = (TestDelimited_LengthPrefixed *)self[3]._vptr_MessageLite;
    if (this != (TestDelimited_LengthPrefixed *)0x0) {
      TestDelimited_LengthPrefixed::~TestDelimited_LengthPrefixed(this);
    }
    operator_delete(this,0x20);
    this_00 = (TestDelimited *)self[3]._internal_metadata_.ptr_;
    if (this_00 != (TestDelimited *)0x0) {
      ~TestDelimited(this_00);
    }
    operator_delete(this_00,0x60);
    pTVar1 = (TestDelimited_GroupLike *)self[4]._vptr_MessageLite;
    if (pTVar1 != (TestDelimited_GroupLike *)0x0) {
      TestDelimited_GroupLike::~TestDelimited_GroupLike(pTVar1);
    }
    operator_delete(pTVar1,0x20);
    pTVar1 = (TestDelimited_GroupLike *)self[4]._internal_metadata_.ptr_;
    if (pTVar1 != (TestDelimited_GroupLike *)0x0) {
      TestDelimited_GroupLike::~TestDelimited_GroupLike(pTVar1);
    }
    operator_delete(pTVar1,0x20);
    this_01 = (NotGroupLikeScope *)self[5]._vptr_MessageLite;
    if (this_01 != (NotGroupLikeScope *)0x0) {
      NotGroupLikeScope::~NotGroupLikeScope(this_01);
    }
    operator_delete(this_01,0x20);
    this_02 = (MessageImport *)self[5]._internal_metadata_.ptr_;
    if (this_02 != (MessageImport *)0x0) {
      MessageImport::~MessageImport(this_02);
    }
    operator_delete(this_02,0x20);
    google::protobuf::internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_delimited.pb.cc"
             ,0x6e1,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline void TestDelimited::SharedDtor(MessageLite& self) {
  TestDelimited& this_ = static_cast<TestDelimited&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.lengthprefixed_;
  delete this_._impl_.nested_;
  delete this_._impl_.grouplike_;
  delete this_._impl_.notgrouplike_;
  delete this_._impl_.notgrouplikescope_;
  delete this_._impl_.messageimport_;
  this_._impl_.~Impl_();
}